

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp6.c
# Opt level: O2

ReturnCode macroid(Global *global,int *c)

{
  ReturnCode RVar1;
  int c_00;
  DEFBUF *tokenp;
  
  if ((global->infile != (FILEINFO *)0x0) && (global->infile->fp != (FILE *)0x0)) {
    global->recursion = 0;
  }
  c_00 = *c;
  while (((RVar1 = FPP_OK, type[c_00] == '\x02' &&
          (tokenp = lookid(global,c_00), tokenp != (DEFBUF *)0x0)) &&
         (RVar1 = expand(global,tokenp), RVar1 == FPP_OK))) {
    c_00 = get(global);
    *c = c_00;
  }
  return RVar1;
}

Assistant:

ReturnCode macroid(struct Global *global, int *c)
{
  /*
   * If c is a letter, scan the id.  if it's #defined, expand it and scan
   * the next character and try again.
   *
   * Else, return the character. If type[c] is a LET, the token is in tokenbuf.
   */
  DEFBUF *dp;
  ReturnCode ret=FPP_OK;
  
  if (global->infile != NULL && global->infile->fp != NULL)
    global->recursion = 0;
  while (type[*c] == LET && (dp = lookid(global, *c)) != NULL) {
    if((ret=expand(global, dp)))
      return(ret);
    *c = get(global);
  }
  return(FPP_OK);
}